

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddSymm.c
# Opt level: O0

DdNode * extraZddSelectOneSubset(DdManager *dd,DdNode *zS)

{
  DdNode *zS_00;
  DdNode *pDVar1;
  DdNode *zTemp;
  DdNode *zS1;
  DdNode *zS0;
  DdNode *zRes;
  DdNode *zS_local;
  DdManager *dd_local;
  
  if (zS == dd->zero) {
    dd_local = (DdManager *)dd->zero;
  }
  else if (zS == dd->one) {
    dd_local = (DdManager *)dd->one;
  }
  else {
    dd_local = (DdManager *)cuddCacheLookup1Zdd(dd,extraZddSelectOneSubset,zS);
    if (dd_local == (DdManager *)0x0) {
      pDVar1 = (zS->type).kids.E;
      zS_00 = (zS->type).kids.T;
      if (pDVar1 == dd->zero) {
        if (zS_00 == dd->zero) {
          __assert_fail("zS1 != z0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/extrab/extraBddSymm.c"
                        ,0x5a8,"DdNode *extraZddSelectOneSubset(DdManager *, DdNode *)");
        }
        pDVar1 = extraZddSelectOneSubset(dd,zS_00);
        if (pDVar1 == (DdNode *)0x0) {
          return (DdNode *)0x0;
        }
        *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + 1;
        zS0 = cuddZddGetNode(dd,zS->index,pDVar1,dd->zero);
        if (zS0 == (DdNode *)0x0) {
          Cudd_RecursiveDerefZdd(dd,pDVar1);
          return (DdNode *)0x0;
        }
        *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + -1;
      }
      else {
        zS0 = extraZddSelectOneSubset(dd,pDVar1);
        if (zS0 == (DdNode *)0x0) {
          return (DdNode *)0x0;
        }
      }
      cuddCacheInsert1(dd,extraZddSelectOneSubset,zS,zS0);
      dd_local = (DdManager *)zS0;
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode * extraZddSelectOneSubset( 
  DdManager * dd, 
  DdNode * zS )
// selects one subset from the ZDD zS
// returns z0 if and only if zS is an empty set of cubes
{
    DdNode * zRes;

    if ( zS == z0 )    return z0;
    if ( zS == z1 )    return z1;
    
    // check cache
    if ( (zRes = cuddCacheLookup1Zdd( dd, extraZddSelectOneSubset, zS )) )
        return zRes;
    else
    {
        DdNode * zS0, * zS1, * zTemp; 

        zS0 = cuddE(zS);
        zS1 = cuddT(zS);

        if ( zS0 != z0 )
        {
            zRes = extraZddSelectOneSubset( dd, zS0 );
            if ( zRes == NULL )
                return NULL;
        }
        else // if ( zS0 == z0 )
        {
            assert( zS1 != z0 );
            zRes = extraZddSelectOneSubset( dd, zS1 );
            if ( zRes == NULL )
                return NULL;
            cuddRef( zRes );

            zRes = cuddZddGetNode( dd, zS->index, zTemp = zRes, z0 );
            if ( zRes == NULL ) 
            {
                Cudd_RecursiveDerefZdd( dd, zTemp );
                return NULL;
            }
            cuddDeref( zTemp );
        }

        // insert the result into cache
        cuddCacheInsert1( dd, extraZddSelectOneSubset, zS, zRes );
        return zRes;
    }       
}